

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O2

size_t derSIDDec2(u32 val,char *oid)

{
  bool bVar1;
  ulong uVar2;
  uint uVar3;
  long lVar4;
  u32 t;
  long lVar5;
  long lVar6;
  
  lVar6 = -1;
  uVar3 = val;
  do {
    lVar5 = lVar6;
    lVar6 = lVar5 + 1;
    bVar1 = 9 < uVar3;
    uVar3 = uVar3 / 10;
  } while (bVar1);
  if ((val % 10 | 0x30) == (int)oid[lVar6]) {
    do {
      if (lVar6 == 0) {
        return lVar5 + 2;
      }
      uVar2 = (ulong)val;
      lVar4 = lVar6 + -1;
      val = (u32)(uVar2 / 10);
      lVar6 = lVar6 + -1;
    } while (((uint)((uVar2 / 10) % 10) | 0x30) == (int)oid[lVar4]);
  }
  return 0xffffffffffffffff;
}

Assistant:

static size_t derSIDDec2(u32 val, const char* oid)
{
	size_t count = 0, pos;
	u32 t = val;
	// число символов для val
	do
		t /= 10, count++;
	while (t > 0);
	// сравнение
	ASSERT(strIsValid(oid));
	pos = count - 1;
	if (oid[pos] != '0' + (char)((t = val) % 10))
		return SIZE_MAX;
	while (pos--)
	{
		t /= 10;
		if (oid[pos] != '0' + (char)(t % 10))
			return SIZE_MAX;
	}
	return count;
}